

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaParser::ReadPrimTriStrips
          (ColladaParser *this,size_t numOffsets,size_t perVertexOffset,Mesh *pMesh,
          vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
          *pPerIndexChannels,size_t currentPrimitive,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *indices)

{
  size_t currentPrimitive_local;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
  *pPerIndexChannels_local;
  Mesh *pMesh_local;
  size_t perVertexOffset_local;
  size_t numOffsets_local;
  ColladaParser *this_local;
  
  if ((currentPrimitive & 1) == 0) {
    CopyVertex(this,0,numOffsets,1,perVertexOffset,pMesh,pPerIndexChannels,currentPrimitive,indices)
    ;
    CopyVertex(this,1,numOffsets,1,perVertexOffset,pMesh,pPerIndexChannels,currentPrimitive,indices)
    ;
    CopyVertex(this,2,numOffsets,1,perVertexOffset,pMesh,pPerIndexChannels,currentPrimitive,indices)
    ;
  }
  else {
    CopyVertex(this,1,numOffsets,1,perVertexOffset,pMesh,pPerIndexChannels,currentPrimitive,indices)
    ;
    CopyVertex(this,0,numOffsets,1,perVertexOffset,pMesh,pPerIndexChannels,currentPrimitive,indices)
    ;
    CopyVertex(this,2,numOffsets,1,perVertexOffset,pMesh,pPerIndexChannels,currentPrimitive,indices)
    ;
  }
  return;
}

Assistant:

void ColladaParser::ReadPrimTriStrips(size_t numOffsets, size_t perVertexOffset, Mesh* pMesh, std::vector<InputChannel>& pPerIndexChannels, size_t currentPrimitive, const std::vector<size_t>& indices) {
    if (currentPrimitive % 2 != 0) {
        //odd tristrip triangles need their indices mangled, to preserve winding direction
        CopyVertex(1, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
        CopyVertex(0, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
        CopyVertex(2, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
    }
    else {//for non tristrips or even tristrip triangles
        CopyVertex(0, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
        CopyVertex(1, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
        CopyVertex(2, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
    }
}